

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O3

BVSparse<Memory::JitArenaAllocator> * __thiscall
BVSparse<Memory::JitArenaAllocator>::OrNew
          (BVSparse<Memory::JitArenaAllocator> *this,BVSparse<Memory::JitArenaAllocator> *bv)

{
  JitArenaAllocator *alloc;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  
  alloc = this->alloc;
  this_00 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,alloc,0x3eba5c);
  this_00->head = (Type_conflict)0x0;
  this_00->lastFoundIndex = (Type_conflict)0x0;
  this_00->alloc = alloc;
  this_00->lastUsedNodePrevNextField = (Type)this_00;
  for_each<&BVUnitT<unsigned_long>::Or>(this_00,this,bv);
  return this_00;
}

Assistant:

BVSparse<TAllocator> *      OrNew(const BVSparse<TAllocator> *bv) const { return this->OrNew(bv, this->alloc); }